

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalTexture2DProjGrad3Offset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture2D *pTVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  pTVar4 = c->textures[0].tex2D;
  fVar6 = (float)pTVar4->m_width;
  fVar7 = (float)pTVar4->m_height;
  fVar6 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar6,c->in[1].m_data[1] * fVar7,
                     fVar6 * c->in[2].m_data[0],fVar7 * c->in[2].m_data[1]);
  pTVar4 = c->textures[0].tex2D;
  tcu::sampleLevelArray2DOffset
            ((ConstPixelBufferAccess *)&local_28,(int)(pTVar4->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar4->m_view).m_numLevels,fVar2 / fVar1,fVar3 / fVar1,fVar6,
             (IVec3 *)c->textures);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar3 = (p->scale).m_data[3];
  fVar6 = (p->bias).m_data[1];
  fVar7 = (p->bias).m_data[2];
  fVar5 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * fStack_24 + fVar6;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar7;
  (c->color).m_data[3] = fVar3 * fStack_1c + fVar5;
  return;
}

Assistant:

static void		evalTexture2DProjGrad3Offset	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), computeLodFromGrad2D(c), p.offset.swizzle(0,1))*p.scale + p.bias; }